

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O2

string * __thiscall
grpc_java_generator::(anonymous_namespace)::MethodPropertiesGetterName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,MethodDescriptor *method)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(*(long *)this + 0x28))(&local_30);
  std::operator+(&local_70,"get_",&local_30);
  std::operator+(&local_50,&local_70,"_method");
  anon_unknown_0::MixedLower(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static inline string MethodPropertiesGetterName(
    const MethodDescriptor *method) {
  return MixedLower("get_" + method->name() + "_method");
}